

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

speed_t tcio_baud(int baud)

{
  undefined4 local_c;
  int baud_local;
  
  if (baud == 600) {
    local_c = 8;
  }
  else if (baud == 0x4b0) {
    local_c = 9;
  }
  else if (baud == 0x4b00) {
    local_c = 0xe;
  }
  else if (baud == 0x9600) {
    local_c = 0xf;
  }
  else if (baud == 0xe100) {
    local_c = 0x1001;
  }
  else if (baud == 0x1c200) {
    local_c = 0x1002;
  }
  else if (baud == 0x38400) {
    local_c = 0x1003;
  }
  else if (baud == 0x70800) {
    local_c = 0x1004;
  }
  else if (baud == 0xe1000) {
    local_c = 0x1007;
  }
  else if (baud == 1000000) {
    local_c = 0x1008;
  }
  else if (baud == 1500000) {
    local_c = 0x100a;
  }
  else if (baud == 2000000) {
    local_c = 0x100b;
  }
  else if (baud == 3000000) {
    local_c = 0x100d;
  }
  else if (baud == 4000000) {
    local_c = 0x100f;
  }
  else {
    local_c = 0x1004;
  }
  return local_c;
}

Assistant:

static speed_t tcio_baud(int baud)
{
#if defined(__QNX__)
    return baud;
#else
#define CASE_BAUD(n) case n : return B ## n; break
    switch(baud) {
        CASE_BAUD(4000000);
        CASE_BAUD(3000000);
        CASE_BAUD(2000000);
        CASE_BAUD(1500000);
        CASE_BAUD(1000000);
        CASE_BAUD(921600);
        CASE_BAUD(460800);
        CASE_BAUD(230400);
        CASE_BAUD(115200);
        CASE_BAUD(57600);
        CASE_BAUD(38400);
        CASE_BAUD(19200);
        CASE_BAUD(1200);
        CASE_BAUD(600);
    }
#undef CASE_BAUD
    return B460800;
#endif
}